

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int ncnn::cpu_riscv_vlenb(void)

{
  try_initialize_global_cpu_info();
  return 0;
}

Assistant:

int cpu_riscv_vlenb()
{
#if C906
    // FIXME xuantie qemu reports all zero auxv flags
    return 16;
#endif
    try_initialize_global_cpu_info();
#if __riscv
    if (!cpu_support_riscv_v())
        return 0;

    int a = 0;
    asm volatile(
        ".word  0xc22026f3  \n" // csrr  a3, vlenb
        "mv     %0, a3      \n"
        : "=r"(a)
        :
        : "memory", "a3");
    return a;
#else
    return 0;
#endif
}